

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O2

void test_2d_static<1ul,1ul,30ul,30ul>(void)

{
  int iVar1;
  undefined4 uVar2;
  int j;
  long lVar3;
  char *pcVar4;
  unsigned_long *puVar5;
  long lVar6;
  int j_1;
  unsigned_long *local_f58;
  size_t true_idx;
  unsigned_long *local_f48;
  int *local_f40;
  int dptr [961];
  
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 900;
  dptr[1] = 0;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x3c1;
  dptr[1] = 0;
  true_idx = 0x3c1;
  puVar5 = (unsigned_long *)dptr;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",puVar5,&true_idx);
  for (lVar3 = 0; lVar3 != 0x1e; lVar3 = lVar3 + 1) {
    local_f48 = puVar5;
    for (lVar6 = 0; lVar6 != 0x3a2; lVar6 = lVar6 + 0x1f) {
      local_f58 = (unsigned_long *)(lVar6 + lVar3);
      true_idx = (size_t)local_f58;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2d,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_f58,&true_idx);
      local_f40 = dptr + true_idx;
      local_f58 = puVar5;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2f,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (int **)&local_f58,&local_f40);
      *(undefined4 *)puVar5 = 0x2a;
      local_f58 = (unsigned_long *)CONCAT44(local_f58._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x33,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",(int *)puVar5,
                 (int *)&local_f58);
      puVar5 = (unsigned_long *)((long)puVar5 + 0x7c);
    }
    puVar5 = (unsigned_long *)((long)local_f48 + 4);
  }
  puVar5 = (unsigned_long *)dptr;
  lVar3 = 0;
  do {
    if (lVar3 == 0x1f) {
      puVar5 = (unsigned_long *)dptr;
      for (lVar3 = 0; lVar3 != 0x1f; lVar3 = lVar3 + 1) {
        local_f48 = puVar5;
        for (lVar6 = 0; lVar6 != 0x3c1; lVar6 = lVar6 + 0x1f) {
          local_f58 = (unsigned_long *)(lVar6 + lVar3);
          true_idx = (size_t)local_f58;
          boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                    ("(l.index(i, j))","true_idx",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x57,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                     (unsigned_long *)&local_f58,&true_idx);
          local_f40 = dptr + true_idx;
          local_f58 = puVar5;
          boost::detail::test_eq_impl<int*,int*>
                    ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x59,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                     (int **)&local_f58,&local_f40);
          if (lVar6 == 0x3a2) {
            local_f58 = (unsigned_long *)CONCAT44(local_f58._4_4_,0x11);
            pcVar4 = "17";
            iVar1 = 0x5e;
          }
          else if (lVar3 == 0x1e) {
            local_f58 = (unsigned_long *)CONCAT44(local_f58._4_4_,0x18);
            pcVar4 = "24";
            iVar1 = 100;
          }
          else {
            local_f58 = (unsigned_long *)CONCAT44(local_f58._4_4_,0x2a);
            pcVar4 = "42";
            iVar1 = 0x6a;
          }
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])",pcVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,iVar1,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                     (int *)puVar5,(int *)&local_f58);
          puVar5 = (unsigned_long *)((long)puVar5 + 0x7c);
        }
        puVar5 = (unsigned_long *)((long)local_f48 + 4);
      }
      return;
    }
    local_f48 = puVar5;
    for (lVar6 = 0; lVar6 != 0x3c1; lVar6 = lVar6 + 0x1f) {
      local_f58 = (unsigned_long *)(lVar3 + lVar6);
      true_idx = (size_t)local_f58;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3c,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_f58,&true_idx);
      local_f40 = dptr + true_idx;
      local_f58 = puVar5;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3e,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (int **)&local_f58,&local_f40);
      if (lVar6 == 0x3a2) {
        uVar2 = 0x11;
        *(int *)puVar5 = 0x11;
        pcVar4 = "17";
        iVar1 = 0x45;
LAB_00103b76:
        local_f58 = (unsigned_long *)CONCAT44(local_f58._4_4_,uVar2);
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])",pcVar4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,iVar1,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                   (int *)puVar5,(int *)&local_f58);
      }
      else if (lVar3 == 0x1e) {
        uVar2 = 0x18;
        *(int *)puVar5 = 0x18;
        pcVar4 = "24";
        iVar1 = 0x4d;
        goto LAB_00103b76;
      }
      puVar5 = (unsigned_long *)((long)puVar5 + 0x7c);
    }
    lVar3 = lVar3 + 1;
    puVar5 = (unsigned_long *)((long)local_f48 + 4);
  } while( true );
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}